

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall SQCompilation::SQParser::LogicalAndExp(SQParser *this)

{
  Expr *pEVar1;
  Expr *in_RDI;
  Expr *rhs;
  Expr *lhs;
  NestingChecker nc;
  SQParser *in_stack_ffffffffffffff98;
  NestingChecker *in_stack_ffffffffffffffa0;
  SQParser *in_stack_ffffffffffffffb0;
  BinExpr *args_1;
  SQParser *in_stack_ffffffffffffffd0;
  BinExpr *local_20;
  SQParser *in_stack_ffffffffffffffe8;
  SQParser *in_stack_fffffffffffffff0;
  
  NestingChecker::NestingChecker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_20 = (BinExpr *)BitwiseOrExp(in_stack_ffffffffffffffe8);
  args_1 = local_20;
  NestingChecker::inc(in_stack_ffffffffffffffa0);
  if (*(long *)&(in_RDI->super_Node)._op == 0x10e) {
    Lex(in_stack_ffffffffffffffb0);
    pEVar1 = LogicalAndExp(in_stack_fffffffffffffff0);
    local_20 = newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                         (in_stack_ffffffffffffffd0,(TreeOp)((ulong)pEVar1 >> 0x20),
                          &args_1->super_Expr,in_RDI);
  }
  NestingChecker::~NestingChecker((NestingChecker *)&stack0xffffffffffffffe8);
  return &local_20->super_Expr;
}

Assistant:

Expr* SQParser::LogicalAndExp()
{
    NestingChecker nc(this);
    Expr *lhs = BitwiseOrExp();
    for (;;) {
        nc.inc();
        switch (_token) {
        case TK_AND: {
            Lex();

            Expr *rhs = LogicalAndExp();
            lhs = newNode<BinExpr>(TO_ANDAND, lhs, rhs);
        }
        default:
            return lhs;
        }
    }
}